

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_intersection_inplace(array_container_t *src_1,array_container_t *src_2)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int threshold;
  int32_t card_2;
  int32_t card_1;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  iVar1 = src_1->cardinality;
  iVar2 = src_2->cardinality;
  if (iVar1 * 0x40 < iVar2) {
    iVar3 = intersect_skewed_uint16(src_1->array,(long)iVar1,src_2->array,(long)iVar2,src_1->array);
    src_1->cardinality = iVar3;
  }
  else if (iVar2 * 0x40 < iVar1) {
    iVar3 = intersect_skewed_uint16(src_2->array,(long)iVar2,src_1->array,(long)iVar1,src_1->array);
    src_1->cardinality = iVar3;
  }
  else {
    iVar3 = intersect_uint16(src_1->array,(long)iVar1,src_2->array,(long)iVar2,src_1->array);
    src_1->cardinality = iVar3;
  }
  return;
}

Assistant:

void array_container_intersection_inplace(array_container_t *src_1,
                                          const array_container_t *src_2) {
    // todo: can any of this be vectorized?
    int32_t card_1 = src_1->cardinality, card_2 = src_2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        src_1->cardinality = intersect_skewed_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    } else if (card_2 * threshold < card_1) {
        src_1->cardinality = intersect_skewed_uint16(
            src_2->array, card_2, src_1->array, card_1, src_1->array);
    } else {
        src_1->cardinality = intersect_uint16(
            src_1->array, card_1, src_2->array, card_2, src_1->array);
    }
}